

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          LogicalType *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2,
          LogicalType params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6)

{
  LogicalType params_2_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_3_00;
  string *value;
  undefined8 in_stack_fffffffffffffe98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffed8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_108;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  undefined1 local_88 [56];
  string local_50 [32];
  
  ::std::__cxx11::string::string((string *)local_88,(string *)values);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            ((ExceptionFormatValue *)(local_88 + 0x20),(ExceptionFormatValue *)local_88,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)(local_88 + 0x20));
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::~string((string *)local_88);
  ::std::__cxx11::string::string((string *)&local_108,(string *)param);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffea8,(LogicalType *)params);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffed8,(string *)params_1);
  LogicalType::LogicalType
            ((LogicalType *)&stack0xfffffffffffffec0,(LogicalType *)params_2._M_dataplus._M_p);
  ::std::__cxx11::string::string(local_a8,(string *)params_2._M_string_length);
  ::std::__cxx11::string::string(local_c8,(string *)params_2.field_2._M_allocated_capacity);
  ::std::__cxx11::string::string(local_e8,(string *)params_2.field_2._8_8_);
  params_2_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8;
  params_2_00._0_8_ = local_a8;
  params_2_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8;
  params_3_00._M_string_length = (size_type)this;
  params_3_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe98;
  params_3_00.field_2 = in_stack_fffffffffffffea8;
  ConstructMessageRecursive<std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,msg,&local_108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffea8,(LogicalType *)&stack0xfffffffffffffed8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffec0,params_2_00,params_3_00,in_stack_fffffffffffffeb8,
             in_stack_fffffffffffffed8);
  ::std::__cxx11::string::~string(local_e8);
  ::std::__cxx11::string::~string(local_c8);
  ::std::__cxx11::string::~string(local_a8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffec0);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffea8);
  ::std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}